

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O2

void __thiscall raptor::TcpServer::OnErrorEvent(TcpServer *this,void *ptr)

{
  uint32_t index;
  shared_ptr<raptor::Connection> con;
  
  index = CheckConnectionId(this,(ConnectionId)ptr);
  if (index != 0xffffffff) {
    GetConnection((TcpServer *)&con,(uint32_t)this);
    if (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      Connection::Shutdown
                (con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true)
      ;
      DeleteConnection(this,index);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&con.super___shared_ptr<raptor::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/linux/tcp_server.cc"
                 ,0xf3,kLogLevelError,"tcpserver: OnErrorEvent found invalid index, cid = %x",ptr);
  return;
}

Assistant:

void TcpServer::OnErrorEvent(void* ptr) {
    ConnectionId cid = (ConnectionId)ptr;
    uint32_t index = CheckConnectionId(cid);
    if (index == InvalidIndex) {
        log_error("tcpserver: OnErrorEvent found invalid index, cid = %x", cid);
        return;
    }

    auto con = GetConnection(index);
    if (con) {
        con->Shutdown(true);
        DeleteConnection(index);
    }
}